

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall google::base_logging::LogStreamBuf::~LogStreamBuf(LogStreamBuf *this)

{
  *(code **)this = __assert_fail;
  std::locale::~locale((locale *)&this->field_0x38);
  operator_delete(this,0x40);
  return;
}

Assistant:

class GLOG_EXPORT LogStreamBuf : public std::streambuf {
 public:
  // REQUIREMENTS: "len" must be >= 2 to account for the '\n' and '\0'.
  LogStreamBuf(char* buf, int len) { setp(buf, buf + len - 2); }

  // This effectively ignores overflow.
  int_type overflow(int_type ch) { return ch; }

  // Legacy public ostrstream method.
  size_t pcount() const { return static_cast<size_t>(pptr() - pbase()); }
  char* pbase() const { return std::streambuf::pbase(); }
}